

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp.cpp
# Opt level: O2

void __thiscall
Json::BuiltStyledStreamWriter::writeCommentBeforeValue(BuiltStyledStreamWriter *this,Value *root)

{
  _Alloc_hider _Var1;
  string local_38;
  
  if (((this->cs_ != None) && (root->comments_ != (CommentInfo *)0x0)) &&
     (root->comments_->comment_ != (char *)0x0)) {
    if ((this->field_0xd8 & 2) == 0) {
      writeIndent(this);
    }
    Value::getComment_abi_cxx11_(&local_38,root,commentBefore);
    for (_Var1._M_p = local_38._M_dataplus._M_p;
        _Var1._M_p != local_38._M_dataplus._M_p + local_38._M_string_length;
        _Var1._M_p = _Var1._M_p + 1) {
      std::operator<<((this->super_StreamWriter).sout_,*_Var1._M_p);
      if (((*_Var1._M_p == '\n') &&
          (_Var1._M_p != local_38._M_dataplus._M_p + local_38._M_string_length)) &&
         (_Var1._M_p[1] == '/')) {
        std::operator<<((this->super_StreamWriter).sout_,(string *)&this->indentString_);
      }
    }
    this->field_0xd8 = this->field_0xd8 & 0xfd;
    std::__cxx11::string::~string((string *)&local_38);
  }
  return;
}

Assistant:

void BuiltStyledStreamWriter::writeCommentBeforeValue(Value const& root) {
  if (cs_ == CommentStyle::None) return;
  if (!root.hasComment(commentBefore))
    return;

  if (!indented_) writeIndent();
  const JSONCPP_STRING& comment = root.getComment(commentBefore);
  JSONCPP_STRING::const_iterator iter = comment.begin();
  while (iter != comment.end()) {
    *sout_ << *iter;
    if (*iter == '\n' &&
       (iter != comment.end() && *(iter + 1) == '/'))
      // writeIndent();  // would write extra newline
      *sout_ << indentString_;
    ++iter;
  }
  indented_ = false;
}